

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void write_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *ppVar1;
  int iVar2;
  int *useDefaultScalingMatrixFlag;
  int (*scalingList) [16];
  int (*paiVar3) [16];
  ulong uVar4;
  int i;
  int (*paiVar5) [16];
  long lVar6;
  int *piVar7;
  
  ppVar1 = h->pps;
  bs_write_ue(b,ppVar1->pic_parameter_set_id);
  bs_write_ue(b,ppVar1->seq_parameter_set_id);
  bs_write_u1(b,ppVar1->entropy_coding_mode_flag);
  bs_write_u1(b,ppVar1->pic_order_present_flag);
  bs_write_ue(b,ppVar1->num_slice_groups_minus1);
  if (0 < ppVar1->num_slice_groups_minus1) {
    bs_write_ue(b,ppVar1->slice_group_map_type);
    switch(ppVar1->slice_group_map_type) {
    case 0:
      for (lVar6 = 0; lVar6 <= ppVar1->num_slice_groups_minus1; lVar6 = lVar6 + 1) {
        bs_write_ue(b,ppVar1->run_length_minus1[lVar6]);
      }
      break;
    case 2:
      for (lVar6 = 0; lVar6 < ppVar1->num_slice_groups_minus1; lVar6 = lVar6 + 1) {
        bs_write_ue(b,ppVar1->top_left[lVar6]);
        bs_write_ue(b,ppVar1->bottom_right[lVar6]);
      }
      break;
    case 3:
    case 4:
    case 5:
      bs_write_u1(b,ppVar1->slice_group_change_direction_flag);
      bs_write_ue(b,ppVar1->slice_group_change_rate_minus1);
      break;
    case 6:
      bs_write_ue(b,ppVar1->pic_size_in_map_units_minus1);
      for (lVar6 = 0; lVar6 <= ppVar1->pic_size_in_map_units_minus1; lVar6 = lVar6 + 1) {
        iVar2 = intlog2(ppVar1->num_slice_groups_minus1 + 1);
        bs_write_u(b,iVar2,ppVar1->slice_group_id[lVar6]);
      }
    }
  }
  bs_write_ue(b,ppVar1->num_ref_idx_l0_active_minus1);
  bs_write_ue(b,ppVar1->num_ref_idx_l1_active_minus1);
  bs_write_u1(b,ppVar1->weighted_pred_flag);
  bs_write_u(b,2,ppVar1->weighted_bipred_idc);
  bs_write_se(b,ppVar1->pic_init_qp_minus26);
  bs_write_se(b,ppVar1->pic_init_qs_minus26);
  bs_write_se(b,ppVar1->chroma_qp_index_offset);
  bs_write_u1(b,ppVar1->deblocking_filter_control_present_flag);
  bs_write_u1(b,ppVar1->constrained_intra_pred_flag);
  bs_write_u1(b,ppVar1->redundant_pic_cnt_present_flag);
  if ((ppVar1->second_chroma_qp_index_offset != 0 || ppVar1->pic_scaling_matrix_present_flag != 0)
      || ppVar1->transform_8x8_mode_flag != 0) {
    bs_write_u1(b,ppVar1->transform_8x8_mode_flag);
    bs_write_u1(b,ppVar1->pic_scaling_matrix_present_flag);
    if (ppVar1->pic_scaling_matrix_present_flag != 0) {
      paiVar5 = ppVar1->ScalingList4x4;
      piVar7 = ppVar1->ScalingList8x8[1] + 0x3a;
      paiVar3 = (int (*) [16])(ppVar1->bottom_right + 6);
      for (uVar4 = 0; (long)uVar4 < (long)ppVar1->transform_8x8_mode_flag * 2 + 6; uVar4 = uVar4 + 1
          ) {
        bs_write_u1(b,piVar7[-0xe8]);
        if (piVar7[-0xe8] != 0) {
          if (uVar4 < 6) {
            iVar2 = 0x10;
            useDefaultScalingMatrixFlag = piVar7 + -0x80;
            scalingList = paiVar5;
          }
          else {
            iVar2 = 0x40;
            useDefaultScalingMatrixFlag = piVar7;
            scalingList = paiVar3;
          }
          write_scaling_list(b,*scalingList,iVar2,useDefaultScalingMatrixFlag);
        }
        piVar7 = piVar7 + 1;
        paiVar3 = paiVar3 + 4;
        paiVar5 = paiVar5 + 1;
      }
    }
    bs_write_se(b,ppVar1->second_chroma_qp_index_offset);
    return;
  }
  return;
}

Assistant:

void write_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 0 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    bs_write_ue(b, pps->pic_parameter_set_id);
    bs_write_ue(b, pps->seq_parameter_set_id);
    bs_write_u1(b, pps->entropy_coding_mode_flag);
    bs_write_u1(b, pps->pic_order_present_flag);
    bs_write_ue(b, pps->num_slice_groups_minus1);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        bs_write_ue(b, pps->slice_group_map_type);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->run_length_minus1[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                bs_write_ue(b, pps->top_left[ i_group ]);
                bs_write_ue(b, pps->bottom_right[ i_group ]);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            bs_write_u1(b, pps->slice_group_change_direction_flag);
            bs_write_ue(b, pps->slice_group_change_rate_minus1);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            bs_write_ue(b, pps->pic_size_in_map_units_minus1);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                bs_write_u(b, v, pps->slice_group_id[ i ]);
            }
        }
    }
    bs_write_ue(b, pps->num_ref_idx_l0_active_minus1);
    bs_write_ue(b, pps->num_ref_idx_l1_active_minus1);
    bs_write_u1(b, pps->weighted_pred_flag);
    bs_write_u(b, 2, pps->weighted_bipred_idc);
    bs_write_se(b, pps->pic_init_qp_minus26);
    bs_write_se(b, pps->pic_init_qs_minus26);
    bs_write_se(b, pps->chroma_qp_index_offset);
    bs_write_u1(b, pps->deblocking_filter_control_present_flag);
    bs_write_u1(b, pps->constrained_intra_pred_flag);
    bs_write_u1(b, pps->redundant_pic_cnt_present_flag);

    int have_more_data = 0;
    if( 0 ) { have_more_data = more_rbsp_data(b); }
    if( 1 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        bs_write_u1(b, pps->transform_8x8_mode_flag);
        bs_write_u1(b, pps->pic_scaling_matrix_present_flag);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                bs_write_u1(b, pps->pic_scaling_list_present_flag[ i ]);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        write_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        write_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        bs_write_se(b, pps->second_chroma_qp_index_offset);
    }

    if( 0 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}